

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fad.h
# Opt level: O1

value_type __thiscall
FadExpr<FadFuncSin<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>_>_>
::dx(FadExpr<FadFuncSin<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>_>_>
     *this,int i)

{
  FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_> *pFVar1
  ;
  FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_> *pFVar2;
  FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_> *pFVar3;
  value_type vVar4;
  double dVar5;
  
  vVar4 = FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>
          ::dx((FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>
                *)&this->fadexpr_,i);
  pFVar1 = (this->fadexpr_).expr_.fadexpr_.left_;
  pFVar2 = (this->fadexpr_).expr_.fadexpr_.right_;
  pFVar3 = (pFVar1->fadexpr_).right_;
  dVar5 = cos(((((pFVar3->fadexpr_).left_)->val_ + ((pFVar3->fadexpr_).right_)->val_) *
              (pFVar1->fadexpr_).left_.constant_) /
              (((pFVar2->fadexpr_).left_)->val_ + ((pFVar2->fadexpr_).right_)->val_));
  return dVar5 * vVar4;
}

Assistant:

value_type dx(int i) const { return fadexpr_.dx(i);}